

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::init
          (PrimitiveSetInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppPVar1;
  ostringstream *this_00;
  WindingUsage WVar2;
  Winding WVar3;
  Context *this_01;
  RenderContext *renderCtx;
  Program *__last;
  Program *__first;
  TestLog *log;
  pointer pPVar4;
  pointer pWVar5;
  byte bVar6;
  int extraout_EAX;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar7;
  ProgramSources *pPVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  TestError *this_02;
  uint uVar12;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>
  *__alloc;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  Program *__args;
  Program *pPVar14;
  Program *extraout_RDX_00;
  char *pcVar15;
  undefined8 extraout_RDX_01;
  ulong uVar16;
  undefined1 in_R9B;
  int programNdx;
  allocator<char> local_429;
  Program *local_428;
  long local_420;
  float local_414;
  undefined1 local_410 [8];
  _Alloc_hider local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  windings;
  undefined1 local_3b0 [40];
  Program local_388;
  SharedPtr<const_glu::ShaderProgram> local_370;
  undefined1 local_360 [40];
  ScopedLogSection section;
  string local_330 [32];
  string fragmentShaderTemplate;
  string floatLit01;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string local_270 [32];
  value_type local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [184];
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  
  windings.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  windings.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  windings.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  WVar2 = this->m_windingUsage;
  if (WVar2 == WINDINGUSAGE_VARY) {
    local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&windings,(value_type *)local_1b0);
    local_1b0._0_4_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&windings,(value_type *)local_1b0);
  }
  else if (WVar2 == WINDINGUSAGE_CW) {
    local_1b0._0_4_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&windings,(value_type *)local_1b0);
  }
  else if (WVar2 == WINDINGUSAGE_CCW) {
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&windings,(value_type *)local_1b0);
  }
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  uVar12 = 0;
  uVar13 = extraout_RDX;
  do {
    if (uVar12 == 2) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
      ::~vector(&windings);
      return extraout_EAX;
    }
    local_414 = 10.0 / (float)(int)(uVar12 | 10);
    uVar12 = uVar12 + 1;
    for (local_420 = 0;
        pWVar5 = windings.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        local_420 <
        (int)((ulong)((long)windings.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)windings.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2);
        local_420 = local_420 + 1) {
      de::floatToString_abi_cxx11_(&floatLit01,(de *)0x2,local_414,(int)uVar13);
      programNdx = (int)(((long)(this->m_programs).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_programs).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertexShaderTemplate,
                 "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                 ,(allocator<char> *)local_1b0);
      local_410._0_4_ = uVar12;
      de::toString<int>((string *)local_3b0,(int *)local_410);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                     (string *)local_3b0);
      std::operator+(&tessellationControlTemplate,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     ") out;\n\nin highp float in_tc_attr[];\n\npatch out highp float in_te_positionOffset;\n\nvoid main (void)\n{\n\tin_te_positionOffset = in_tc_attr[6];\n\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
                    );
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)local_3b0);
      WVar3 = pWVar5[local_420];
      pcVar15 = (char *)(ulong)WVar3;
      (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                (&fragmentShaderTemplate,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
                 this->m_spacing,WVar3,(uint)this->m_usePointMode,(bool)in_R9B);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                     &fragmentShaderTemplate);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     "\npatch in highp float in_te_positionOffset;\n\nout highp vec4 in_f_color;\ninvariant out highp vec3 out_te_tessCoord;\n\nvoid main (void)\n{\n\tgl_Position = vec4(gl_TessCoord.xy*"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     &floatLit01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                     " - in_te_positionOffset + float(gl_PrimitiveID)*0.1, 0.0, 1.0);\n\tin_f_color = vec4("
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                     &floatLit01);
      std::operator+(&tessellationEvaluationTemplate,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     ");\n\tout_te_tessCoord = gl_TessCoord;\n}\n");
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)local_3b0);
      std::__cxx11::string::~string((string *)local_410);
      std::__cxx11::string::~string((string *)local_360);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fragmentShaderTemplate,
                 "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                 ,(allocator<char> *)local_1b0);
      WVar3 = pWVar5[local_420];
      pSVar7 = (ShaderProgram *)operator_new(0xd0);
      this_01 = (this->super_TestCase).m_context;
      renderCtx = this_01->m_renderCtx;
      memset(local_1b0,0,0xac);
      local_1b0._176_8_ = (pointer)0x0;
      uStack_f8 = 0;
      uStack_f7 = 0;
      uStack_f0 = 0;
      uStack_ef = 0;
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1d0,(_anonymous_namespace_ *)this_01,
                 (Context *)vertexShaderTemplate._M_dataplus._M_p,pcVar15);
      glu::VertexSource::VertexSource((VertexSource *)local_3b0,&local_1d0);
      pPVar8 = glu::ProgramSources::operator<<
                         ((ProgramSources *)local_1b0,(ShaderSource *)local_3b0);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)tessellationControlTemplate._M_dataplus._M_p,pcVar15);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)local_410,&local_1f0);
      pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)local_410);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_210,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,pcVar15);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)local_360,&local_210);
      pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)local_360);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_230,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)fragmentShaderTemplate._M_dataplus._M_p,pcVar15);
      glu::FragmentSource::FragmentSource((FragmentSource *)&section,&local_230);
      pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)&section);
      std::__cxx11::string::string<std::allocator<char>>(local_270,"out_te_tessCoord",&local_429);
      std::__cxx11::string::string((string *)&local_250,local_270);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pPVar8->transformFeedbackVaryings,&local_250);
      pPVar8->transformFeedbackBufferMode = 0x8c8c;
      glu::ShaderProgram::ShaderProgram(pSVar7,renderCtx,pPVar8);
      de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_370,pSVar7);
      local_388.program.m_ptr = local_370.m_ptr;
      local_388.program.m_state = local_370.m_state;
      if (local_370.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_370.m_state)->strongRefCount = (local_370.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_370.m_state)->weakRefCount = (local_370.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      __last = (this->m_programs).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_388.winding = WVar3;
      if (__last == (this->m_programs).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __first = (this->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)__last - (long)__first;
        if (lVar9 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = lVar9 / 0x18;
        pPVar14 = (Program *)(lVar9 % 0x18);
        uVar11 = uVar10;
        if (__last == __first) {
          uVar11 = 1;
        }
        uVar16 = uVar11 + uVar10;
        __alloc = (allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>
                   *)0x555555555555555;
        if (0x555555555555554 < uVar16) {
          uVar16 = 0x555555555555555;
        }
        if (CARRY8(uVar11,uVar10)) {
          uVar16 = 0x555555555555555;
        }
        if (uVar16 == 0) {
          local_428 = (Program *)0x0;
        }
        else {
          local_428 = (Program *)operator_new(uVar16 * 0x18);
          pPVar14 = extraout_RDX_00;
        }
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>
                  ((allocator_type *)(local_428 + uVar10),&local_388,pPVar14);
        pPVar14 = std::
                  __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program*,deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>>
                            (__first,__last,local_428,__alloc);
        pPVar14 = std::
                  __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program*,deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>>
                            (__last,__last,pPVar14 + 1,__alloc);
        std::
        _Destroy<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program*>
                  (__first,__last);
        lVar9 = (long)(this->m_programs).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
        std::
        _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
        ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                         *)__first,(pointer)(lVar9 / 0x18),lVar9 % 0x18);
        (this->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_start = local_428;
        (this->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar14;
        (this->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_428 + uVar16;
      }
      else {
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>
                  ((allocator_type *)__last,&local_388,__args);
        ppPVar1 = &(this->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_388.program);
      de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_370);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::string::~string(local_330);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)(local_360 + 8));
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)(local_3b0 + 8));
      std::__cxx11::string::~string((string *)&local_1d0);
      glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      de::toString<int>((string *)local_3b0,&programNdx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     "Program",(string *)local_3b0);
      de::toString<int>((string *)local_360,&programNdx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                     "Program ",(string *)local_360);
      tcu::ScopedLogSection::ScopedLogSection
                (&section,log,(string *)local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      std::__cxx11::string::~string((string *)local_410);
      std::__cxx11::string::~string((string *)local_360);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)local_3b0);
      pSVar7 = (this->m_programs).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr;
      if ((programNdx == 0) || (bVar6 = (pSVar7->m_program).m_info.linkOk, (bool)bVar6 == false)) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar7);
        bVar6 = (((this->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info.
                linkOk;
      }
      if ((bVar6 & 1) == 0) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Program compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0xe80);
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < programNdx) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Note: program ");
        std::ostream::operator<<(this_00,programNdx);
        std::operator<<((ostream *)this_00,
                        " is similar to above, except some constants are different, and: ");
        pPVar4 = (this->m_programs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_410 = (undefined1  [8])&local_400;
        local_408._M_p = (pointer)0x0;
        local_400._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"winding mode ");
        WVar3 = pPVar4[-1].winding;
        pcVar15 = (char *)0x0;
        if (WVar3 == WINDING_CW) {
          pcVar15 = "cw";
        }
        if (WVar3 == WINDING_CCW) {
          pcVar15 = "ccw";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_360,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b0,pcVar15);
        std::__cxx11::string::~string((string *)local_3b0);
        std::__cxx11::string::~string((string *)local_410);
        std::operator<<((ostream *)(local_1b0 + 8),(string *)local_360);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
      std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
      std::__cxx11::string::~string((string *)&tessellationControlTemplate);
      std::__cxx11::string::~string((string *)&vertexShaderTemplate);
      std::__cxx11::string::~string((string *)&floatLit01);
      uVar13 = extraout_RDX_01;
    }
  } while( true );
}

Assistant:

void PrimitiveSetInvarianceCase::init (void)
{
	const int			numDifferentConstantExprCases = 2;
	vector<Winding>		windings;
	switch (m_windingUsage)
	{
		case WINDINGUSAGE_CCW:		windings.push_back(WINDING_CCW); break;
		case WINDINGUSAGE_CW:		windings.push_back(WINDING_CW); break;
		case WINDINGUSAGE_VARY:		windings.push_back(WINDING_CCW);
									windings.push_back(WINDING_CW); break;
		default: DE_ASSERT(false);
	}

	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int constantExprCaseNdx = 0; constantExprCaseNdx < numDifferentConstantExprCases; constantExprCaseNdx++)
	{
		for (int windingCaseNdx = 0; windingCaseNdx < (int)windings.size(); windingCaseNdx++)
		{
			const string	floatLit01 = de::floatToString(10.0f / (float)(constantExprCaseNdx + 10), 2);
			const int		programNdx = (int)m_programs.size();

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "in highp float in_v_attr;\n"
															 "out highp float in_tc_attr;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 "layout (vertices = " + de::toString(constantExprCaseNdx+1) + ") out;\n"
															 "\n"
															 "in highp float in_tc_attr[];\n"
															 "\n"
															 "patch out highp float in_te_positionOffset;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_te_positionOffset = in_tc_attr[6];\n"
															 "\n"
															 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
															 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
															 "\n"
															 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
															 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
															 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
															 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, windings[windingCaseNdx], m_usePointMode) +
															 "\n"
															 "patch in highp float in_te_positionOffset;\n"
															 "\n"
															 "out highp vec4 in_f_color;\n"
															 "invariant out highp vec3 out_te_tessCoord;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - in_te_positionOffset + float(gl_PrimitiveID)*0.1, 0.0, 1.0);\n"
															 "	in_f_color = vec4(" + floatLit01 + ");\n"
															 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "layout (location = 0) out mediump vec4 o_color;\n"
															 "\n"
															 "in highp vec4 in_f_color;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(windings[windingCaseNdx],
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
					<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
					<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
					<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
					<< glu::TransformFeedbackVarying		("out_te_tessCoord")
					<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}